

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

Bone * __thiscall Assimp::Ogre::Skeleton::BoneById(Skeleton *this,uint16_t id)

{
  bool bVar1;
  reference ppBVar2;
  __normal_iterator<Assimp::Ogre::Bone_*const_*,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
  local_30;
  __normal_iterator<Assimp::Ogre::Bone_*const_*,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
  local_28;
  const_iterator iter;
  uint16_t id_local;
  Skeleton *this_local;
  
  iter._M_current._6_2_ = id;
  local_28._M_current =
       (Bone **)std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::begin
                          (&this->bones);
  while( true ) {
    local_30._M_current =
         (Bone **)std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::end
                            (&this->bones);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) {
      return (Bone *)0x0;
    }
    ppBVar2 = __gnu_cxx::
              __normal_iterator<Assimp::Ogre::Bone_*const_*,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
              ::operator*(&local_28);
    if ((*ppBVar2)->id == iter._M_current._6_2_) break;
    __gnu_cxx::
    __normal_iterator<Assimp::Ogre::Bone_*const_*,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
    ::operator++(&local_28);
  }
  ppBVar2 = __gnu_cxx::
            __normal_iterator<Assimp::Ogre::Bone_*const_*,_std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>_>
            ::operator*(&local_28);
  return *ppBVar2;
}

Assistant:

Bone *Skeleton::BoneById(uint16_t id) const
{
    for(BoneList::const_iterator iter = bones.begin(); iter != bones.end(); ++iter)
    {
        if ((*iter)->id == id)
            return (*iter);
    }
    return 0;
}